

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_SINCDEC_v(DisasContext_conflict1 *s,arg_incdec2_cnt *a)

{
  int esz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint uVar2;
  TCGv_i64 pTVar3;
  int iVar4;
  uintptr_t o;
  
  esz = a->esz;
  if (esz != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar2 = decode_pred_count(s->sve_len,a->pat,esz);
    iVar4 = uVar2 * a->imm;
    if (iVar4 == 0) {
      do_mov_z(s,a->rd,a->rn);
    }
    else {
      _Var1 = sve_access_check_aarch64(s);
      if (_Var1) {
        pTVar3 = tcg_const_i64_aarch64(tcg_ctx,(long)iVar4);
        do_sat_addsub_vec((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(int)s->uc->tcg_ctx,
                          a->esz,a->rd,(TCGv_i64)(ulong)(uint)a->rn,SUB81(pTVar3,0),a->u != 0);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      }
    }
  }
  return esz != 0;
}

Assistant:

static bool trans_SINCDEC_v(DisasContext *s, arg_incdec2_cnt *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }

    unsigned fullsz = vec_full_reg_size(s);
    unsigned numelem = decode_pred_count(fullsz, a->pat, a->esz);
    int inc = numelem * a->imm;

    if (inc != 0) {
        if (sve_access_check(s)) {
            TCGv_i64 t = tcg_const_i64(tcg_ctx, inc);
            do_sat_addsub_vec(s, a->esz, a->rd, a->rn, t, a->u, a->d);
            tcg_temp_free_i64(tcg_ctx, t);
        }
    } else {
        do_mov_z(s, a->rd, a->rn);
    }
    return true;
}